

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_generator.cc
# Opt level: O3

void grpc_go_generator::anon_unknown_0::GenerateError
               (Printer *printer,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars,bool multiple_return)

{
  mapped_type *pmVar1;
  char *pcVar2;
  key_type local_48;
  
  (*printer->_vptr_Printer[2])(printer,vars,"if $Error_Check$ {\n");
  (*printer->_vptr_Printer[5])(printer);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Return","");
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_48);
  pcVar2 = "err";
  if (multiple_return) {
    pcVar2 = "nil, err";
  }
  std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,(ulong)pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (*printer->_vptr_Printer[2])(printer,vars,"return $Return$\n");
  (*printer->_vptr_Printer[6])(printer);
  (*printer->_vptr_Printer[3])(printer,"}\n");
  return;
}

Assistant:

static void GenerateError(grpc_generator::Printer *printer,
                   std::map<grpc::string, grpc::string> vars,
                   const bool multiple_return = true) {
  printer->Print(vars, "if $Error_Check$ {\n");
  printer->Indent();
  vars["Return"] = multiple_return ? "nil, err" : "err";
  printer->Print(vars, "return $Return$\n");
  printer->Outdent();
  printer->Print("}\n");
}